

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O0

void sf2cute::RIFFListChunk::WriteHeader(ostream *out,string *name,size_type size)

{
  undefined8 uVar1;
  ostream *poVar2;
  length_error *this;
  long lVar3;
  exception *anon_var_0;
  iostate old_exception_bits;
  ostringstream local_198 [8];
  ostringstream message_builder;
  uint32_t local_20;
  size_type size_local;
  string *name_local;
  ostream *out_local;
  
  if (0xffffffff < size) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"RIFF chunk \"");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::operator<<(poVar2,"\" size too large.");
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::length_error::length_error(this,(string *)&old_exception_bits);
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  std::ios::exceptions();
  uVar1 = *(undefined8 *)(*(long *)out + -0x18);
  std::operator|(_S_badbit,_S_failbit);
  std::ios::exceptions((int)out + (int)uVar1);
  std::ostream::write((char *)out,0x1404eb);
  local_20 = (uint32_t)size;
  InsertInt32L<std::ostream>(out,local_20);
  lVar3 = std::__cxx11::string::data();
  std::__cxx11::string::size();
  std::ostream::write((char *)out,lVar3);
  return;
}

Assistant:

void RIFFListChunk::WriteHeader(std::ostream & out,
    const std::string & name,
    size_type size) {
  // Throw exception if the chunk size exceeds the maximum.
  if (size > UINT32_MAX) {
    std::ostringstream message_builder;
    message_builder << "RIFF chunk \"" << name << "\" size too large.";
    throw std::length_error(message_builder.str());
  }

  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk ID "LIST".
    out.write("LIST", 4);

    // Write the chunk size.
    InsertInt32L(out, static_cast<uint32_t>(size));

    // Write the list type.
    out.write(name.data(), name.size());
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}